

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionMatching.cpp
# Opt level: O2

bool is_no_ll_fpr_store(Instruction *instr,MatchParam<Register> src,MatchParam<int> offset,
                       MatchParam<Register> dest)

{
  bool bVar1;
  int32_t iVar2;
  MatchParam<Register> local_1c;
  MatchParam<Register> local_18;
  Register local_14;
  Register local_12;
  
  if (instr->kind == SWC1) {
    local_1c = dest;
    local_18 = src;
    local_12 = InstructionAtom::get_reg(instr->src);
    bVar1 = MatchParam<Register>::operator==(&local_18,&local_12);
    if ((bVar1) &&
       ((iVar2 = InstructionAtom::get_imm(instr->src + 1), ((ulong)offset >> 0x20 & 1) != 0 ||
        (iVar2 == offset.value)))) {
      local_14 = InstructionAtom::get_reg(instr->src + 2);
      bVar1 = MatchParam<Register>::operator==(&local_1c,&local_14);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool is_no_ll_fpr_store(const Instruction& instr,
                        MatchParam<Register> src,
                        MatchParam<int> offset,
                        MatchParam<Register> dest) {
  return instr.kind == InstructionKind::SWC1 && src == instr.src[0].get_reg() &&
         offset == instr.src[1].get_imm() && dest == instr.src[2].get_reg();
}